

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int havingToWhereExprCb(Walker *pWalker,Expr *pExpr)

{
  undefined8 uVar1;
  HavingToWhereCtx *pHVar2;
  sqlite3 *db;
  Expr *pLeft;
  char cVar3;
  undefined2 uVar4;
  u32 uVar5;
  Expr *pEVar6;
  long lVar7;
  int iVar8;
  Expr *pEVar9;
  Walker *pWVar10;
  Expr *pEVar11;
  byte bVar12;
  Expr t;
  Walker local_68;
  
  bVar12 = 0;
  iVar8 = 0;
  if (pExpr->op != 'G') {
    local_68.pParse = pWalker->pParse;
    pHVar2 = (pWalker->u).pHavingCtx;
    local_68.u = (anon_union_8_11_9d6f43ba_for_u)pHVar2->pGroupBy;
    local_68.eCode = '\x01';
    local_68.xExprCallback = exprNodeIsConstantOrGroupBy;
    local_68.xSelectCallback = (_func_int_Walker_ptr_Select_ptr *)0x0;
    walkExpr(&local_68,pExpr);
    iVar8 = 1;
    if (local_68.eCode != '\0') {
      db = pWalker->pParse->db;
      pEVar6 = sqlite3ExprAlloc(db,0x86,sqlite3IntTokens + 1,0);
      if (pEVar6 != (Expr *)0x0) {
        pLeft = *pHVar2->ppWhere;
        pEVar9 = pEVar6;
        pWVar10 = &local_68;
        for (lVar7 = 9; lVar7 != 0; lVar7 = lVar7 + -1) {
          pWVar10->pParse = *(undefined8 *)pEVar9;
          pEVar9 = (Expr *)((long)pEVar9 + (ulong)bVar12 * -0x10 + 8);
          pWVar10 = (Walker *)((long)pWVar10 + ((ulong)bVar12 * -2 + 1) * 8);
        }
        pEVar9 = pExpr;
        pEVar11 = pEVar6;
        for (lVar7 = 9; lVar7 != 0; lVar7 = lVar7 + -1) {
          cVar3 = pEVar9->affinity;
          uVar4 = *(undefined2 *)&pEVar9->field_0x2;
          uVar5 = pEVar9->flags;
          pEVar11->op = pEVar9->op;
          pEVar11->affinity = cVar3;
          *(undefined2 *)&pEVar11->field_0x2 = uVar4;
          pEVar11->flags = uVar5;
          pEVar9 = (Expr *)((long)pEVar9 + (ulong)bVar12 * -0x10 + 8);
          pEVar11 = (Expr *)((long)pEVar11 + (ulong)bVar12 * -0x10 + 8);
        }
        pWVar10 = &local_68;
        for (lVar7 = 9; lVar7 != 0; lVar7 = lVar7 + -1) {
          uVar1 = pWVar10->pParse;
          pExpr->op = (char)uVar1;
          pExpr->affinity = (char)((ulong)uVar1 >> 8);
          *(short *)&pExpr->field_0x2 = (short)((ulong)uVar1 >> 0x10);
          pExpr->flags = (int)((ulong)uVar1 >> 0x20);
          pWVar10 = (Walker *)((long)pWVar10 + ((ulong)bVar12 * -2 + 1) * 8);
          pExpr = (Expr *)((long)pExpr + (ulong)bVar12 * -0x10 + 8);
        }
        pEVar6 = sqlite3ExprAnd(db,pLeft,pEVar6);
        *pHVar2->ppWhere = pEVar6;
      }
    }
  }
  return iVar8;
}

Assistant:

static int havingToWhereExprCb(Walker *pWalker, Expr *pExpr){
  if( pExpr->op!=TK_AND ){
    struct HavingToWhereCtx *p = pWalker->u.pHavingCtx;
    if( sqlite3ExprIsConstantOrGroupBy(pWalker->pParse, pExpr, p->pGroupBy) ){
      sqlite3 *db = pWalker->pParse->db;
      Expr *pNew = sqlite3ExprAlloc(db, TK_INTEGER, &sqlite3IntTokens[1], 0);
      if( pNew ){
        Expr *pWhere = *(p->ppWhere);
        SWAP(Expr, *pNew, *pExpr);
        pNew = sqlite3ExprAnd(db, pWhere, pNew);
        *(p->ppWhere) = pNew;
      }
    }
    return WRC_Prune;
  }
  return WRC_Continue;
}